

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

void __thiscall
google::protobuf::DescriptorBuilder::AddWarning
          (DescriptorBuilder *this,string *element_name,Message *descriptor,ErrorLocation location,
          string *error)

{
  ErrorCollector *pEVar1;
  LogMessage *pLVar2;
  LogFinisher local_59;
  LogMessage local_58;
  
  pEVar1 = this->error_collector_;
  if (pEVar1 != (ErrorCollector *)0x0) {
    (*pEVar1->_vptr_ErrorCollector[3])
              (pEVar1,&this->filename_,element_name,descriptor,(ulong)location,error);
    return;
  }
  internal::LogMessage::LogMessage
            (&local_58,LOGLEVEL_WARNING,
             "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.cc"
             ,0x10a0);
  pLVar2 = internal::LogMessage::operator<<(&local_58,&this->filename_);
  pLVar2 = internal::LogMessage::operator<<(pLVar2," ");
  pLVar2 = internal::LogMessage::operator<<(pLVar2,element_name);
  pLVar2 = internal::LogMessage::operator<<(pLVar2,": ");
  pLVar2 = internal::LogMessage::operator<<(pLVar2,error);
  internal::LogFinisher::operator=(&local_59,pLVar2);
  internal::LogMessage::~LogMessage(&local_58);
  return;
}

Assistant:

void DescriptorBuilder::AddWarning(
    const std::string& element_name, const Message& descriptor,
    DescriptorPool::ErrorCollector::ErrorLocation location,
    const std::string& error) {
  if (error_collector_ == nullptr) {
    GOOGLE_LOG(WARNING) << filename_ << " " << element_name << ": " << error;
  } else {
    error_collector_->AddWarning(filename_, element_name, &descriptor, location,
                                 error);
  }
}